

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementHexaANCF_3813_9.cpp
# Opt level: O1

double __thiscall
chrono::fea::ChElementHexaANCF_3813_9::Calc_detJ0
          (ChElementHexaANCF_3813_9 *this,double x,double y,double z,ShapeVector *Nx,ShapeVector *Ny
          ,ShapeVector *Nz,ChMatrixNM<double,_1,_3> *Nx_d0,ChMatrixNM<double,_1,_3> *Ny_d0,
          ChMatrixNM<double,_1,_3> *Nz_d0)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  ActualDstType actualDst_2;
  ActualDstType actualDst_1;
  ActualDstType actualDst;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  
  ShapeFunctionsDerivativeX(this,Nx,x,y,z);
  ShapeFunctionsDerivativeY(this,Ny,x,y,z);
  ShapeFunctionsDerivativeZ(this,Nz,x,y,z);
  dVar1 = (Nx->super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>).m_storage.m_data.
          array[0];
  auVar25._0_8_ =
       dVar1 * (this->m_d0).super_PlainObjectBase<Eigen::Matrix<double,_11,_3,_1,_11,_3>_>.m_storage
               .m_data.array[0];
  auVar25._8_8_ =
       dVar1 * (this->m_d0).super_PlainObjectBase<Eigen::Matrix<double,_11,_3,_1,_11,_3>_>.m_storage
               .m_data.array[1];
  dVar2 = (Nx->super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>).m_storage.m_data.
          array[1];
  auVar29._8_8_ = dVar2;
  auVar29._0_8_ = dVar2;
  auVar23 = vfmadd231pd_fma(auVar25,auVar29,
                            *(undefined1 (*) [16])
                             ((this->m_d0).
                              super_PlainObjectBase<Eigen::Matrix<double,_11,_3,_1,_11,_3>_>.
                              m_storage.m_data.array + 3));
  dVar3 = (Nx->super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>).m_storage.m_data.
          array[2];
  auVar33._8_8_ = dVar3;
  auVar33._0_8_ = dVar3;
  auVar23 = vfmadd231pd_fma(auVar23,auVar33,
                            *(undefined1 (*) [16])
                             ((this->m_d0).
                              super_PlainObjectBase<Eigen::Matrix<double,_11,_3,_1,_11,_3>_>.
                              m_storage.m_data.array + 6));
  dVar4 = (Nx->super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>).m_storage.m_data.
          array[3];
  auVar37._8_8_ = dVar4;
  auVar37._0_8_ = dVar4;
  auVar23 = vfmadd231pd_fma(auVar23,auVar37,
                            *(undefined1 (*) [16])
                             ((this->m_d0).
                              super_PlainObjectBase<Eigen::Matrix<double,_11,_3,_1,_11,_3>_>.
                              m_storage.m_data.array + 9));
  dVar5 = (Nx->super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>).m_storage.m_data.
          array[4];
  auVar40._8_8_ = dVar5;
  auVar40._0_8_ = dVar5;
  auVar23 = vfmadd231pd_fma(auVar23,auVar40,
                            *(undefined1 (*) [16])
                             ((this->m_d0).
                              super_PlainObjectBase<Eigen::Matrix<double,_11,_3,_1,_11,_3>_>.
                              m_storage.m_data.array + 0xc));
  dVar6 = (Nx->super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>).m_storage.m_data.
          array[5];
  auVar46._8_8_ = dVar6;
  auVar46._0_8_ = dVar6;
  auVar23 = vfmadd231pd_fma(auVar23,auVar46,
                            *(undefined1 (*) [16])
                             ((this->m_d0).
                              super_PlainObjectBase<Eigen::Matrix<double,_11,_3,_1,_11,_3>_>.
                              m_storage.m_data.array + 0xf));
  dVar7 = (Nx->super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>).m_storage.m_data.
          array[6];
  auVar50._8_8_ = dVar7;
  auVar50._0_8_ = dVar7;
  auVar23 = vfmadd231pd_fma(auVar23,auVar50,
                            *(undefined1 (*) [16])
                             ((this->m_d0).
                              super_PlainObjectBase<Eigen::Matrix<double,_11,_3,_1,_11,_3>_>.
                              m_storage.m_data.array + 0x12));
  dVar8 = (Nx->super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>).m_storage.m_data.
          array[7];
  auVar53._8_8_ = dVar8;
  auVar53._0_8_ = dVar8;
  auVar23 = vfmadd231pd_fma(auVar23,auVar53,
                            *(undefined1 (*) [16])
                             ((this->m_d0).
                              super_PlainObjectBase<Eigen::Matrix<double,_11,_3,_1,_11,_3>_>.
                              m_storage.m_data.array + 0x15));
  dVar9 = (Nx->super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>).m_storage.m_data.
          array[8];
  auVar57._8_8_ = dVar9;
  auVar57._0_8_ = dVar9;
  auVar23 = vfmadd231pd_fma(auVar23,auVar57,
                            *(undefined1 (*) [16])
                             ((this->m_d0).
                              super_PlainObjectBase<Eigen::Matrix<double,_11,_3,_1,_11,_3>_>.
                              m_storage.m_data.array + 0x18));
  dVar10 = (Nx->super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>).m_storage.m_data.
           array[9];
  auVar60._8_8_ = dVar10;
  auVar60._0_8_ = dVar10;
  auVar23 = vfmadd231pd_fma(auVar23,auVar60,
                            *(undefined1 (*) [16])
                             ((this->m_d0).
                              super_PlainObjectBase<Eigen::Matrix<double,_11,_3,_1,_11,_3>_>.
                              m_storage.m_data.array + 0x1b));
  dVar11 = (Nx->super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>).m_storage.m_data.
           array[10];
  auVar64._8_8_ = dVar11;
  auVar64._0_8_ = dVar11;
  auVar23 = vfmadd231pd_fma(auVar23,auVar64,
                            *(undefined1 (*) [16])
                             ((this->m_d0).
                              super_PlainObjectBase<Eigen::Matrix<double,_11,_3,_1,_11,_3>_>.
                              m_storage.m_data.array + 0x1e));
  dVar12 = (this->m_d0).super_PlainObjectBase<Eigen::Matrix<double,_11,_3,_1,_11,_3>_>.m_storage.
           m_data.array[2];
  dVar13 = (this->m_d0).super_PlainObjectBase<Eigen::Matrix<double,_11,_3,_1,_11,_3>_>.m_storage.
           m_data.array[5];
  dVar14 = (this->m_d0).super_PlainObjectBase<Eigen::Matrix<double,_11,_3,_1,_11,_3>_>.m_storage.
           m_data.array[8];
  dVar15 = (this->m_d0).super_PlainObjectBase<Eigen::Matrix<double,_11,_3,_1,_11,_3>_>.m_storage.
           m_data.array[0xb];
  dVar16 = (this->m_d0).super_PlainObjectBase<Eigen::Matrix<double,_11,_3,_1,_11,_3>_>.m_storage.
           m_data.array[0xe];
  dVar17 = (this->m_d0).super_PlainObjectBase<Eigen::Matrix<double,_11,_3,_1,_11,_3>_>.m_storage.
           m_data.array[0x11];
  dVar18 = (this->m_d0).super_PlainObjectBase<Eigen::Matrix<double,_11,_3,_1,_11,_3>_>.m_storage.
           m_data.array[0x14];
  dVar19 = (this->m_d0).super_PlainObjectBase<Eigen::Matrix<double,_11,_3,_1,_11,_3>_>.m_storage.
           m_data.array[0x17];
  dVar20 = (this->m_d0).super_PlainObjectBase<Eigen::Matrix<double,_11,_3,_1,_11,_3>_>.m_storage.
           m_data.array[0x1a];
  dVar21 = (this->m_d0).super_PlainObjectBase<Eigen::Matrix<double,_11,_3,_1,_11,_3>_>.m_storage.
           m_data.array[0x1d];
  dVar22 = (this->m_d0).super_PlainObjectBase<Eigen::Matrix<double,_11,_3,_1,_11,_3>_>.m_storage.
           m_data.array[0x20];
  *(undefined1 (*) [16])
   (Nx_d0->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.m_data.array =
       auVar23;
  (Nx_d0->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.m_data.array[2] =
       dVar1 * dVar12 + dVar2 * dVar13 + dVar3 * dVar14 + dVar4 * dVar15 + dVar5 * dVar16 +
       dVar6 * dVar17 + dVar7 * dVar18 + dVar8 * dVar19 +
       dVar9 * dVar20 + dVar10 * dVar21 + dVar11 * dVar22;
  dVar1 = (Ny->super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>).m_storage.m_data.
          array[0];
  auVar26._0_8_ =
       dVar1 * (this->m_d0).super_PlainObjectBase<Eigen::Matrix<double,_11,_3,_1,_11,_3>_>.m_storage
               .m_data.array[0];
  auVar26._8_8_ =
       dVar1 * (this->m_d0).super_PlainObjectBase<Eigen::Matrix<double,_11,_3,_1,_11,_3>_>.m_storage
               .m_data.array[1];
  dVar2 = (Ny->super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>).m_storage.m_data.
          array[1];
  auVar30._8_8_ = dVar2;
  auVar30._0_8_ = dVar2;
  auVar23 = vfmadd231pd_fma(auVar26,auVar30,
                            *(undefined1 (*) [16])
                             ((this->m_d0).
                              super_PlainObjectBase<Eigen::Matrix<double,_11,_3,_1,_11,_3>_>.
                              m_storage.m_data.array + 3));
  dVar3 = (Ny->super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>).m_storage.m_data.
          array[2];
  auVar34._8_8_ = dVar3;
  auVar34._0_8_ = dVar3;
  auVar23 = vfmadd231pd_fma(auVar23,auVar34,
                            *(undefined1 (*) [16])
                             ((this->m_d0).
                              super_PlainObjectBase<Eigen::Matrix<double,_11,_3,_1,_11,_3>_>.
                              m_storage.m_data.array + 6));
  dVar4 = (Ny->super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>).m_storage.m_data.
          array[3];
  auVar38._8_8_ = dVar4;
  auVar38._0_8_ = dVar4;
  auVar23 = vfmadd231pd_fma(auVar23,auVar38,
                            *(undefined1 (*) [16])
                             ((this->m_d0).
                              super_PlainObjectBase<Eigen::Matrix<double,_11,_3,_1,_11,_3>_>.
                              m_storage.m_data.array + 9));
  dVar5 = (Ny->super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>).m_storage.m_data.
          array[4];
  auVar41._8_8_ = dVar5;
  auVar41._0_8_ = dVar5;
  auVar23 = vfmadd231pd_fma(auVar23,auVar41,
                            *(undefined1 (*) [16])
                             ((this->m_d0).
                              super_PlainObjectBase<Eigen::Matrix<double,_11,_3,_1,_11,_3>_>.
                              m_storage.m_data.array + 0xc));
  dVar6 = (Ny->super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>).m_storage.m_data.
          array[5];
  auVar47._8_8_ = dVar6;
  auVar47._0_8_ = dVar6;
  auVar23 = vfmadd231pd_fma(auVar23,auVar47,
                            *(undefined1 (*) [16])
                             ((this->m_d0).
                              super_PlainObjectBase<Eigen::Matrix<double,_11,_3,_1,_11,_3>_>.
                              m_storage.m_data.array + 0xf));
  dVar7 = (Ny->super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>).m_storage.m_data.
          array[6];
  auVar51._8_8_ = dVar7;
  auVar51._0_8_ = dVar7;
  auVar23 = vfmadd231pd_fma(auVar23,auVar51,
                            *(undefined1 (*) [16])
                             ((this->m_d0).
                              super_PlainObjectBase<Eigen::Matrix<double,_11,_3,_1,_11,_3>_>.
                              m_storage.m_data.array + 0x12));
  dVar8 = (Ny->super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>).m_storage.m_data.
          array[7];
  auVar54._8_8_ = dVar8;
  auVar54._0_8_ = dVar8;
  auVar23 = vfmadd231pd_fma(auVar23,auVar54,
                            *(undefined1 (*) [16])
                             ((this->m_d0).
                              super_PlainObjectBase<Eigen::Matrix<double,_11,_3,_1,_11,_3>_>.
                              m_storage.m_data.array + 0x15));
  dVar9 = (Ny->super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>).m_storage.m_data.
          array[8];
  auVar58._8_8_ = dVar9;
  auVar58._0_8_ = dVar9;
  auVar23 = vfmadd231pd_fma(auVar23,auVar58,
                            *(undefined1 (*) [16])
                             ((this->m_d0).
                              super_PlainObjectBase<Eigen::Matrix<double,_11,_3,_1,_11,_3>_>.
                              m_storage.m_data.array + 0x18));
  dVar10 = (Ny->super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>).m_storage.m_data.
           array[9];
  auVar61._8_8_ = dVar10;
  auVar61._0_8_ = dVar10;
  auVar23 = vfmadd231pd_fma(auVar23,auVar61,
                            *(undefined1 (*) [16])
                             ((this->m_d0).
                              super_PlainObjectBase<Eigen::Matrix<double,_11,_3,_1,_11,_3>_>.
                              m_storage.m_data.array + 0x1b));
  dVar11 = (Ny->super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>).m_storage.m_data.
           array[10];
  auVar65._8_8_ = dVar11;
  auVar65._0_8_ = dVar11;
  auVar23 = vfmadd231pd_fma(auVar23,auVar65,
                            *(undefined1 (*) [16])
                             ((this->m_d0).
                              super_PlainObjectBase<Eigen::Matrix<double,_11,_3,_1,_11,_3>_>.
                              m_storage.m_data.array + 0x1e));
  dVar12 = (this->m_d0).super_PlainObjectBase<Eigen::Matrix<double,_11,_3,_1,_11,_3>_>.m_storage.
           m_data.array[2];
  dVar13 = (this->m_d0).super_PlainObjectBase<Eigen::Matrix<double,_11,_3,_1,_11,_3>_>.m_storage.
           m_data.array[5];
  dVar14 = (this->m_d0).super_PlainObjectBase<Eigen::Matrix<double,_11,_3,_1,_11,_3>_>.m_storage.
           m_data.array[8];
  dVar15 = (this->m_d0).super_PlainObjectBase<Eigen::Matrix<double,_11,_3,_1,_11,_3>_>.m_storage.
           m_data.array[0xb];
  dVar16 = (this->m_d0).super_PlainObjectBase<Eigen::Matrix<double,_11,_3,_1,_11,_3>_>.m_storage.
           m_data.array[0xe];
  dVar17 = (this->m_d0).super_PlainObjectBase<Eigen::Matrix<double,_11,_3,_1,_11,_3>_>.m_storage.
           m_data.array[0x11];
  dVar18 = (this->m_d0).super_PlainObjectBase<Eigen::Matrix<double,_11,_3,_1,_11,_3>_>.m_storage.
           m_data.array[0x14];
  dVar19 = (this->m_d0).super_PlainObjectBase<Eigen::Matrix<double,_11,_3,_1,_11,_3>_>.m_storage.
           m_data.array[0x17];
  dVar20 = (this->m_d0).super_PlainObjectBase<Eigen::Matrix<double,_11,_3,_1,_11,_3>_>.m_storage.
           m_data.array[0x1a];
  dVar21 = (this->m_d0).super_PlainObjectBase<Eigen::Matrix<double,_11,_3,_1,_11,_3>_>.m_storage.
           m_data.array[0x1d];
  dVar22 = (this->m_d0).super_PlainObjectBase<Eigen::Matrix<double,_11,_3,_1,_11,_3>_>.m_storage.
           m_data.array[0x20];
  *(undefined1 (*) [16])
   (Ny_d0->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.m_data.array =
       auVar23;
  (Ny_d0->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.m_data.array[2] =
       dVar1 * dVar12 + dVar2 * dVar13 + dVar3 * dVar14 + dVar4 * dVar15 + dVar5 * dVar16 +
       dVar6 * dVar17 + dVar7 * dVar18 + dVar8 * dVar19 +
       dVar9 * dVar20 + dVar10 * dVar21 + dVar11 * dVar22;
  dVar1 = (Nz->super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>).m_storage.m_data.
          array[0];
  auVar27._0_8_ =
       dVar1 * (this->m_d0).super_PlainObjectBase<Eigen::Matrix<double,_11,_3,_1,_11,_3>_>.m_storage
               .m_data.array[0];
  auVar27._8_8_ =
       dVar1 * (this->m_d0).super_PlainObjectBase<Eigen::Matrix<double,_11,_3,_1,_11,_3>_>.m_storage
               .m_data.array[1];
  dVar2 = (Nz->super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>).m_storage.m_data.
          array[1];
  auVar31._8_8_ = dVar2;
  auVar31._0_8_ = dVar2;
  auVar23 = vfmadd231pd_fma(auVar27,auVar31,
                            *(undefined1 (*) [16])
                             ((this->m_d0).
                              super_PlainObjectBase<Eigen::Matrix<double,_11,_3,_1,_11,_3>_>.
                              m_storage.m_data.array + 3));
  dVar3 = (Nz->super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>).m_storage.m_data.
          array[2];
  auVar35._8_8_ = dVar3;
  auVar35._0_8_ = dVar3;
  auVar23 = vfmadd231pd_fma(auVar23,auVar35,
                            *(undefined1 (*) [16])
                             ((this->m_d0).
                              super_PlainObjectBase<Eigen::Matrix<double,_11,_3,_1,_11,_3>_>.
                              m_storage.m_data.array + 6));
  dVar4 = (Nz->super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>).m_storage.m_data.
          array[3];
  auVar39._8_8_ = dVar4;
  auVar39._0_8_ = dVar4;
  auVar23 = vfmadd231pd_fma(auVar23,auVar39,
                            *(undefined1 (*) [16])
                             ((this->m_d0).
                              super_PlainObjectBase<Eigen::Matrix<double,_11,_3,_1,_11,_3>_>.
                              m_storage.m_data.array + 9));
  dVar5 = (Nz->super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>).m_storage.m_data.
          array[4];
  auVar42._8_8_ = dVar5;
  auVar42._0_8_ = dVar5;
  auVar23 = vfmadd231pd_fma(auVar23,auVar42,
                            *(undefined1 (*) [16])
                             ((this->m_d0).
                              super_PlainObjectBase<Eigen::Matrix<double,_11,_3,_1,_11,_3>_>.
                              m_storage.m_data.array + 0xc));
  dVar6 = (Nz->super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>).m_storage.m_data.
          array[5];
  auVar48._8_8_ = dVar6;
  auVar48._0_8_ = dVar6;
  auVar23 = vfmadd231pd_fma(auVar23,auVar48,
                            *(undefined1 (*) [16])
                             ((this->m_d0).
                              super_PlainObjectBase<Eigen::Matrix<double,_11,_3,_1,_11,_3>_>.
                              m_storage.m_data.array + 0xf));
  dVar7 = (Nz->super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>).m_storage.m_data.
          array[6];
  auVar52._8_8_ = dVar7;
  auVar52._0_8_ = dVar7;
  auVar23 = vfmadd231pd_fma(auVar23,auVar52,
                            *(undefined1 (*) [16])
                             ((this->m_d0).
                              super_PlainObjectBase<Eigen::Matrix<double,_11,_3,_1,_11,_3>_>.
                              m_storage.m_data.array + 0x12));
  dVar8 = (Nz->super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>).m_storage.m_data.
          array[7];
  auVar55._8_8_ = dVar8;
  auVar55._0_8_ = dVar8;
  auVar23 = vfmadd231pd_fma(auVar23,auVar55,
                            *(undefined1 (*) [16])
                             ((this->m_d0).
                              super_PlainObjectBase<Eigen::Matrix<double,_11,_3,_1,_11,_3>_>.
                              m_storage.m_data.array + 0x15));
  dVar9 = (Nz->super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>).m_storage.m_data.
          array[8];
  auVar59._8_8_ = dVar9;
  auVar59._0_8_ = dVar9;
  auVar23 = vfmadd231pd_fma(auVar23,auVar59,
                            *(undefined1 (*) [16])
                             ((this->m_d0).
                              super_PlainObjectBase<Eigen::Matrix<double,_11,_3,_1,_11,_3>_>.
                              m_storage.m_data.array + 0x18));
  dVar10 = (Nz->super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>).m_storage.m_data.
           array[9];
  auVar62._8_8_ = dVar10;
  auVar62._0_8_ = dVar10;
  auVar23 = vfmadd231pd_fma(auVar23,auVar62,
                            *(undefined1 (*) [16])
                             ((this->m_d0).
                              super_PlainObjectBase<Eigen::Matrix<double,_11,_3,_1,_11,_3>_>.
                              m_storage.m_data.array + 0x1b));
  dVar11 = (Nz->super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>).m_storage.m_data.
           array[10];
  auVar66._8_8_ = dVar11;
  auVar66._0_8_ = dVar11;
  auVar23 = vfmadd231pd_fma(auVar23,auVar66,
                            *(undefined1 (*) [16])
                             ((this->m_d0).
                              super_PlainObjectBase<Eigen::Matrix<double,_11,_3,_1,_11,_3>_>.
                              m_storage.m_data.array + 0x1e));
  dVar8 = dVar1 * (this->m_d0).super_PlainObjectBase<Eigen::Matrix<double,_11,_3,_1,_11,_3>_>.
                  m_storage.m_data.array[2] +
          dVar2 * (this->m_d0).super_PlainObjectBase<Eigen::Matrix<double,_11,_3,_1,_11,_3>_>.
                  m_storage.m_data.array[5] +
          dVar3 * (this->m_d0).super_PlainObjectBase<Eigen::Matrix<double,_11,_3,_1,_11,_3>_>.
                  m_storage.m_data.array[8] +
          dVar4 * (this->m_d0).super_PlainObjectBase<Eigen::Matrix<double,_11,_3,_1,_11,_3>_>.
                  m_storage.m_data.array[0xb] +
          dVar5 * (this->m_d0).super_PlainObjectBase<Eigen::Matrix<double,_11,_3,_1,_11,_3>_>.
                  m_storage.m_data.array[0xe] +
          dVar6 * (this->m_d0).super_PlainObjectBase<Eigen::Matrix<double,_11,_3,_1,_11,_3>_>.
                  m_storage.m_data.array[0x11] +
          dVar7 * (this->m_d0).super_PlainObjectBase<Eigen::Matrix<double,_11,_3,_1,_11,_3>_>.
                  m_storage.m_data.array[0x14] +
          dVar8 * (this->m_d0).super_PlainObjectBase<Eigen::Matrix<double,_11,_3,_1,_11,_3>_>.
                  m_storage.m_data.array[0x17] +
          dVar9 * (this->m_d0).super_PlainObjectBase<Eigen::Matrix<double,_11,_3,_1,_11,_3>_>.
                  m_storage.m_data.array[0x1a] +
          dVar10 * (this->m_d0).super_PlainObjectBase<Eigen::Matrix<double,_11,_3,_1,_11,_3>_>.
                   m_storage.m_data.array[0x1d] +
          dVar11 * (this->m_d0).super_PlainObjectBase<Eigen::Matrix<double,_11,_3,_1,_11,_3>_>.
                   m_storage.m_data.array[0x20];
  *(undefined1 (*) [16])
   (Nz_d0->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.m_data.array =
       auVar23;
  (Nz_d0->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.m_data.array[2] =
       dVar8;
  dVar1 = (Ny_d0->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.m_data.
          array[0];
  auVar28._8_8_ = 0;
  auVar28._0_8_ = dVar1;
  dVar2 = (Ny_d0->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.m_data.
          array[1];
  dVar3 = (Nx_d0->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.m_data.
          array[0];
  auVar36._8_8_ = 0;
  auVar36._0_8_ = dVar3;
  dVar4 = (Nx_d0->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.m_data.
          array[1];
  dVar5 = (Nz_d0->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.m_data.
          array[0];
  auVar49._8_8_ = 0;
  auVar49._0_8_ = dVar5;
  dVar6 = (Nz_d0->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.m_data.
          array[1];
  dVar7 = (Nx_d0->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.m_data.
          array[2];
  auVar23._8_8_ = 0;
  auVar23._0_8_ = dVar8;
  auVar43._8_8_ = 0;
  auVar43._0_8_ = dVar3 * dVar2;
  auVar56._8_8_ = 0;
  auVar56._0_8_ = dVar1 * dVar6 * dVar7;
  auVar23 = vfmadd231sd_fma(auVar56,auVar23,auVar43);
  dVar1 = (Ny_d0->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.m_data.
          array[2];
  auVar63._8_8_ = 0;
  auVar63._0_8_ = dVar1;
  auVar44._8_8_ = 0;
  auVar44._0_8_ = dVar5 * dVar4;
  auVar23 = vfmadd213sd_fma(auVar44,auVar63,auVar23);
  auVar32._8_8_ = 0;
  auVar32._0_8_ = dVar7 * dVar2;
  auVar23 = vfnmadd213sd_fma(auVar32,auVar49,auVar23);
  auVar45._8_8_ = 0;
  auVar45._0_8_ = dVar1 * dVar6;
  auVar23 = vfnmadd213sd_fma(auVar45,auVar36,auVar23);
  auVar24._8_8_ = 0;
  auVar24._0_8_ = dVar4 * dVar8;
  auVar23 = vfnmadd213sd_fma(auVar24,auVar28,auVar23);
  return auVar23._0_8_;
}

Assistant:

double ChElementHexaANCF_3813_9::Calc_detJ0(double x,
                                            double y,
                                            double z,
                                            ShapeVector& Nx,
                                            ShapeVector& Ny,
                                            ShapeVector& Nz,
                                            ChMatrixNM<double, 1, 3>& Nx_d0,
                                            ChMatrixNM<double, 1, 3>& Ny_d0,
                                            ChMatrixNM<double, 1, 3>& Nz_d0) {
    ShapeFunctionsDerivativeX(Nx, x, y, z);
    ShapeFunctionsDerivativeY(Ny, x, y, z);
    ShapeFunctionsDerivativeZ(Nz, x, y, z);

    Nx_d0 = Nx * m_d0;
    Ny_d0 = Ny * m_d0;
    Nz_d0 = Nz * m_d0;

    double detJ0 = Nx_d0(0, 0) * Ny_d0(0, 1) * Nz_d0(0, 2) + Ny_d0(0, 0) * Nz_d0(0, 1) * Nx_d0(0, 2) +
                   Nz_d0(0, 0) * Nx_d0(0, 1) * Ny_d0(0, 2) - Nx_d0(0, 2) * Ny_d0(0, 1) * Nz_d0(0, 0) -
                   Ny_d0(0, 2) * Nz_d0(0, 1) * Nx_d0(0, 0) - Nz_d0(0, 2) * Nx_d0(0, 1) * Ny_d0(0, 0);

    return detJ0;
}